

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadLocalStorage.h
# Opt level: O3

void TLS::BASE<tls_data_t,_1024U>::_details::thread_exiting(void *value)

{
  int iVar1;
  ulong uVar2;
  undefined8 uVar3;
  
  pthread_setspecific(BASE<tls_data_t,1024u>::_details::_pthread_key,(void *)0x0);
  while( true ) {
    iVar1 = BASE<tls_data_t,1024u>::_d;
    LOCK();
    BASE<tls_data_t,1024u>::_d = 1;
    UNLOCK();
    if (iVar1 == 0) break;
    sched_yield();
  }
  if (BASE<tls_data_t,1024u>::_details::_thread_exit_callback != 0) {
    if (*(long *)(BASE<tls_data_t,1024u>::_details::_thread_exit_callback + 0x10) == 0) {
      uVar3 = std::__throw_bad_function_call();
      BASE<tls_data_t,1024u>::_d = 0;
      _Unwind_Resume(uVar3);
    }
    (**(code **)(BASE<tls_data_t,1024u>::_details::_thread_exit_callback + 0x18))
              (BASE<tls_data_t,1024u>::_details::_thread_exit_callback,
               &DAT_001051a0 + ((ulong)value & 0xffffffff) * 0x18);
  }
  *(undefined4 *)(&DAT_001051a8 + ((ulong)value & 0xffffffff) * 0x18) = 0xffffffff;
  uVar2 = (ulong)DAT_0010c1a0;
  DAT_0010c1a0 = DAT_0010c1a0 + 1;
  *(int *)(&DAT_0010b1a0 + uVar2 * 4) = (int)value;
  BASE<tls_data_t,1024u>::_d = 0;
  return;
}

Assistant:

static void thread_exiting(void * value)
#endif
			{
#ifndef _MSC_VER
				pthread_setspecific(_pthread_key, NULL);
#endif
				uint32_t index = (uint32_t)(uintptr_t)value;
				TLS_ASSERT_(index < MAX_THREADS);
				{
					std::lock_guard<_details> lock(_d);
					TLS_ASSERT_(_d._data[index]._index == index);
					if (_thread_exit_callback)
						_thread_exit_callback->operator()(_d._data[index]);
					_d._data[index]._index = UNUSED_INDEX;
					_d._available_ids[_d._available_id_index++] = index;
					TLS_ASSERT_(_d._available_id_index <= MAX_THREADS);
				}
			}